

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O0

void __thiscall xemmai::t_child::f_wait(t_child *this,int a_options)

{
  __pid_t _Var1;
  int *piVar2;
  __pid_t pid;
  int a_options_local;
  t_child *this_local;
  
  if (this->v_pid != 0) {
    while (_Var1 = waitpid(this->v_pid,&this->v_status,a_options), _Var1 != this->v_pid) {
      if (_Var1 != -1) {
        return;
      }
      piVar2 = __errno_location();
      if (*piVar2 != 4) {
        xemmai::portable::f_throw_system_error();
      }
    }
    this->v_pid = 0;
  }
  return;
}

Assistant:

void f_wait(int a_options)
	{
		if (!v_pid) return;
		while (true) {
			auto pid = waitpid(v_pid, &v_status, a_options);
			if (pid == v_pid) break;
			if (pid != -1) return;
			if (errno != EINTR) portable::f_throw_system_error();
		}
		v_pid = 0;
	}